

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void approx(double *x,double *y,int N,double *xout,double *yout,int Nout)

{
  double dVar1;
  int local_38;
  int i;
  int Nout_local;
  double *yout_local;
  double *xout_local;
  int N_local;
  double *y_local;
  double *x_local;
  
  for (local_38 = 0; local_38 < Nout; local_38 = local_38 + 1) {
    if ((xout[local_38] != xout[local_38]) || (NAN(xout[local_38]) || NAN(xout[local_38]))) {
      yout[local_38] = xout[local_38];
    }
    else {
      dVar1 = interpolate_linear_sorted_ascending(x,y,N,xout[local_38]);
      yout[local_38] = dVar1;
    }
  }
  return;
}

Assistant:

void approx(double *x,double *y, int N,double *xout, double *yout,int Nout) {
    int i;
	/* x and y should be sorted in ascending order. x has all unique values
		xout contains equally spaced Nout values from lowest x[0]
		to highest x[N-1].Outputs y[out] are Nout interpolated values.
	*/

    for(i = 0; i < Nout;++i) {
        if (xout[i] == xout[i]) {
            yout[i] = interpolate_linear_sorted_ascending(x,y,N,xout[i]);
        } else {
            yout[i] = xout[i];
        }
    }

}